

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O2

bool __thiscall Gaussian::Iterate(Gaussian *this)

{
  bool bVar1;
  int iVar2;
  mapped_type *this_00;
  const_reference pvVar3;
  key_type local_14;
  
  iVar2 = GaussianOrder(&this->ijk);
  this_00 = std::
            map<int,_const_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>_>_>
            ::at((map<int,_const_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>_>_>
                  *)&gorder_map,&local_14);
  if ((long)iVar2 + 1U <
      (ulong)(((long)(this_00->
                     super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
              (long)(this_00->
                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                    )._M_impl.super__Vector_impl_data._M_start) / 0xc)) {
    pvVar3 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::at
                       (this_00,(long)iVar2 + 1U);
    *(undefined8 *)(this->ijk)._M_elems = *(undefined8 *)pvVar3->_M_elems;
    (this->ijk)._M_elems[2] = pvVar3->_M_elems[2];
    bVar1 = operator_cast_to_bool(this);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Iterate(void)
    {
        size_t idx = static_cast<size_t>(index()) + 1;
        const auto & v = gorder_map.at(am());

        if(idx >= v.size())
            return false;
        else
        {
            ijk = v.at(idx);
            return *this;
        }
    }